

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall wasm::TranslateToFuzzReader::setupGlobals(TranslateToFuzzReader *this)

{
  Module *module;
  bool bVar1;
  Index IVar2;
  Index IVar3;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *pvVar4;
  Name *pNVar5;
  Expression *pEVar6;
  reference this_00;
  pointer pGVar7;
  Global *global_00;
  Name name;
  byte local_151;
  string_view local_120;
  string_view local_110;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_100;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> global_2;
  FindAll<wasm::RefAs> local_e0;
  uintptr_t local_c8;
  Expression *local_c0;
  Expression *init;
  Type TStack_b0;
  Mutability mutability;
  Type type;
  size_t index;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global_1;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *__range2;
  anon_class_8_1_8991fb9c aStack_78;
  uint percentUsedInitialGlobals;
  anon_class_8_1_8991fb9c useGlobalLater;
  FindAll<wasm::GlobalGet> local_60;
  uintptr_t local_48;
  Name local_40;
  reference local_30;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *__range1;
  TranslateToFuzzReader *this_local;
  
  pvVar4 = &this->wasm->globals;
  __end1 = std::
           vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ::begin(pvVar4);
  global = (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
           std::
           vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ::end(pvVar4);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                                     *)&global), bVar1) {
    local_30 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
               ::operator*(&__end1);
    pGVar7 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->(local_30)
    ;
    bVar1 = Importable::imported(&pGVar7->super_Importable);
    if (bVar1) {
      if ((this->preserveImportsAndExports & 1U) == 0) {
        Name::Name(&local_40);
        pGVar7 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (local_30);
        pNVar5 = Name::operator=(&(pGVar7->super_Importable).base,&local_40);
        pGVar7 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (local_30);
        Name::operator=(&(pGVar7->super_Importable).module,pNVar5);
        pGVar7 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (local_30);
        local_48 = (pGVar7->type).id;
        pEVar6 = makeConst(this,(Type)local_48);
        pGVar7 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (local_30);
        pGVar7->init = pEVar6;
      }
    }
    else {
      bVar1 = FeatureSet::hasGC(&this->wasm->features);
      local_151 = 0;
      if (!bVar1) {
        pGVar7 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (local_30);
        FindAll<wasm::GlobalGet>::FindAll(&local_60,pGVar7->init);
        bVar1 = std::vector<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>::empty
                          (&local_60.list);
        local_151 = bVar1 ^ 0xff;
        FindAll<wasm::GlobalGet>::~FindAll(&local_60);
      }
      if ((local_151 & 1) != 0) {
        pGVar7 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (local_30);
        useGlobalLater.this = (TranslateToFuzzReader *)(pGVar7->type).id;
        pEVar6 = makeConst(this,(Type)useGlobalLater.this);
        pGVar7 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (local_30);
        pGVar7->init = pEVar6;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
    ::operator++(&__end1);
  }
  aStack_78.this = this;
  bVar1 = std::
          vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
          ::empty(&this->wasm->globals);
  if (!bVar1) {
    IVar2 = upTo(this,100);
    pvVar4 = &this->wasm->globals;
    __end2 = std::
             vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ::begin(pvVar4);
    global_1 = (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
               std::
               vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ::end(pvVar4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                                       *)&global_1), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                ::operator*(&__end2);
      IVar3 = upTo(this,100);
      if (IVar3 < IVar2) {
        pGVar7 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::get(this_00);
        setupGlobals::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffff88,pGVar7);
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  IVar2 = upTo(this,(this->fuzzParams->super_FuzzParams).MAX_GLOBALS);
  type.id = (uintptr_t)IVar2;
  do {
    if (type.id == 0) {
      return;
    }
    TStack_b0 = getConcreteType(this);
    bVar1 = oneIn(this,3);
    init._4_4_ = (uint)!bVar1;
    local_c8 = TStack_b0.id;
    local_c0 = makeTrivial(this,TStack_b0);
    FindAll<wasm::RefAs>::FindAll(&local_e0,local_c0);
    bVar1 = std::vector<wasm::RefAs_*,_std::allocator<wasm::RefAs_*>_>::empty(&local_e0.list);
    FindAll<wasm::RefAs>::~FindAll(&local_e0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      bVar1 = Type::isTuple(&stack0xffffffffffffff50);
      if ((bVar1) && (bVar1 = Expression::is<wasm::TupleMake>(local_c0), !bVar1)) {
        global_2._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
        super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
             (__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>)
             (__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>)
             TStack_b0.id;
        local_c0 = makeConst(this,TStack_b0);
        bVar1 = Expression::is<wasm::TupleMake>(local_c0);
        if (!bVar1) {
          __assert_fail("init->is<TupleMake>()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                        ,0x2b7,"void wasm::TranslateToFuzzReader::setupGlobals()");
        }
      }
    }
    else {
      TStack_b0 = getMVPType(this);
      local_c0 = makeConst(this,TStack_b0);
    }
    module = this->wasm;
    Name::Name((Name *)&local_120,"global$");
    local_110 = (string_view)Names::getValidGlobalName(module,(Name)local_120);
    name.super_IString.str._M_str = (char *)local_110._M_len;
    name.super_IString.str._M_len = (size_t)&local_100;
    Builder::makeGlobal(name,(Type)local_110._M_str,(Expression *)TStack_b0.id,(Mutability)local_c0)
    ;
    global_00 = (Global *)wasm::Module::addGlobal((unique_ptr *)this->wasm);
    setupGlobals::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffff88,global_00);
    std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr(&local_100);
    type.id = type.id - 1;
  } while( true );
}

Assistant:

void TranslateToFuzzReader::setupGlobals() {
  // If there were initial wasm contents, there may be imported globals. That
  // would be a problem in the fuzzer harness as we'd error if we do not
  // provide them (and provide the proper type, etc.).
  // Avoid that, so that all the standard fuzzing infrastructure can always
  // run the wasm.
  for (auto& global : wasm.globals) {
    if (global->imported()) {
      if (!preserveImportsAndExports) {
        // Remove import info from imported globals, and give them a simple
        // initializer.
        global->module = global->base = Name();
        global->init = makeConst(global->type);
      }
    } else {
      // If the initialization referred to an imported global, it no longer can
      // point to the same global after we make it a non-imported global unless
      // GC is enabled, since before GC, Wasm only made imported globals
      // available in constant expressions.
      if (!wasm.features.hasGC() &&
          !FindAll<GlobalGet>(global->init).list.empty()) {
        global->init = makeConst(global->type);
      }
    }
  }

  auto useGlobalLater = [&](Global* global) {
    auto type = global->type;
    auto name = global->name;
    globalsByType[type].push_back(name);
    if (global->mutable_) {
      mutableGlobalsByType[type].push_back(name);
    } else {
      immutableGlobalsByType[type].push_back(name);
      if (global->imported()) {
        importedImmutableGlobalsByType[type].push_back(name);
      }
    }
  };

  // Randomly assign some globals from initial content to be ignored for the
  // fuzzer to use. Such globals will only be used from initial content. This is
  // important to preserve some real-world patterns, like the "once" pattern in
  // which a global is used in one function only. (If we randomly emitted gets
  // and sets of such globals, we'd with very high probability end up breaking
  // that pattern, and not fuzzing it at all.)
  if (!wasm.globals.empty()) {
    unsigned percentUsedInitialGlobals = upTo(100);
    for (auto& global : wasm.globals) {
      if (upTo(100) < percentUsedInitialGlobals) {
        useGlobalLater(global.get());
      }
    }
  }

  // Create new random globals.
  for (size_t index = upTo(fuzzParams->MAX_GLOBALS); index > 0; --index) {
    auto type = getConcreteType();
    // Prefer immutable ones as they can be used in global.gets in other
    // globals, for more interesting patterns.
    auto mutability = oneIn(3) ? Builder::Mutable : Builder::Immutable;

    // We can only make something trivial (like a constant) in a global
    // initializer.
    auto* init = makeTrivial(type);

    if (!FindAll<RefAs>(init).list.empty()) {
      // When creating this initial value we ended up emitting a RefAs, which
      // means we had to stop in the middle of an overly-nested struct or array,
      // which we can break out of using ref.as_non_null of a nullable ref. That
      // traps in normal code, which is bad enough, but it does not even
      // validate in a global. Switch to something safe instead.
      type = getMVPType();
      init = makeConst(type);
    } else if (type.isTuple() && !init->is<TupleMake>()) {
      // For now we disallow anything but tuple.make at the top level of tuple
      // globals (see details in wasm-binary.cpp). In the future we may allow
      // global.get or other things here.
      init = makeConst(type);
      assert(init->is<TupleMake>());
    }
    auto global = builder.makeGlobal(
      Names::getValidGlobalName(wasm, "global$"), type, init, mutability);
    useGlobalLater(wasm.addGlobal(std::move(global)));
  }
}